

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall
spectest::CommandRunner::OnAssertInvalidCommand(CommandRunner *this,AssertInvalidCommand *command)

{
  uint32_t uVar1;
  string_view module_filename;
  bool bVar2;
  Result result_00;
  undefined8 uVar3;
  Result result;
  AssertInvalidCommand *command_local;
  CommandRunner *this_local;
  
  uVar1 = (command->super_CommandMixin<(wabt::CommandType)5>).super_Command.line;
  module_filename =
       (string_view)
       std::__cxx11::string::operator_cast_to_basic_string_view((string *)&command->filename);
  result_00 = ReadInvalidModule(this,uVar1,module_filename,command->type,"assert_invalid");
  bVar2 = wabt::Succeeded(result_00);
  if (bVar2) {
    uVar1 = (command->super_CommandMixin<(wabt::CommandType)5>).super_Command.line;
    uVar3 = std::__cxx11::string::c_str();
    PrintError(this,uVar1,"expected module to be invalid: \"%s\"",uVar3);
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    bVar2 = ValidIR(&command->filename);
    if (bVar2) {
      uVar1 = (command->super_CommandMixin<(wabt::CommandType)5>).super_Command.line;
      uVar3 = std::__cxx11::string::c_str();
      PrintError(this,uVar1,"IR Validator thinks module is valid: \"%s\"",uVar3);
      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result CommandRunner::OnAssertInvalidCommand(
    const AssertInvalidCommand* command) {
  wabt::Result result = ReadInvalidModule(command->line, command->filename,
                                          command->type, "assert_invalid");
  if (Succeeded(result)) {
    PrintError(command->line, "expected module to be invalid: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  if (ValidIR(command->filename)) {
    PrintError(command->line, "IR Validator thinks module is valid: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  return wabt::Result::Ok;
}